

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

bool __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::Calc(MP<135UL,_GF2::MOLex<135UL>_> *this,WW<135UL> *val)

{
  ulong uVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  ulong uVar4;
  bool bVar5;
  
  p_Var3 = (this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>).
           super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 == (_List_node_base *)this) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    do {
      if ((~*(ulong *)&((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)(p_Var3 + 1))->
                       super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> |
          val->_words[0]) == 0xffffffffffffffff) {
        uVar1 = 0;
        do {
          uVar4 = uVar1;
          if (uVar4 == 2) break;
          uVar1 = uVar4 + 1;
        } while ((~*(ulong *)((long)(p_Var3 + 1) + 8U + uVar4 * 8) | val->_words[uVar4 + 1]) ==
                 0xffffffffffffffff);
        bVar5 = 1 < uVar4;
      }
      else {
        bVar5 = false;
      }
      bVar2 = (bool)(bVar2 ^ bVar5);
      p_Var3 = (((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)&p_Var3->_M_next)->
               super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)this);
  }
  return bVar2;
}

Assistant:

bool Calc(const WW<_n>& val) const
	{
		bool ret = 0;
		for (const_iterator iter = begin(); iter != end(); ++iter)
			ret ^= iter->Calc(val);
		return ret;
	}